

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O1

void point_add(u8 *r,u8 *p,u8 *q)

{
  u8 *puVar1;
  u8 *puVar2;
  u8 *puVar3;
  byte *pbVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  u32 i;
  long lVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  u8 u [30];
  u8 t [30];
  u8 s [30];
  byte local_98 [32];
  byte local_78 [32];
  byte local_58 [40];
  
  puVar1 = q + 0x1e;
  lVar8 = 0;
  do {
    puVar3 = p + lVar8;
    if (*puVar3 != '\0') break;
    bVar9 = lVar8 != 0x1d;
    lVar8 = lVar8 + 1;
  } while (bVar9);
  puVar2 = p + 0x1e;
  if (*puVar3 == '\0') {
    lVar8 = -0x1e;
    do {
      if (p[lVar8 + 0x3c] != '\0') goto LAB_001027ad;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0);
    uVar5 = *(undefined8 *)q;
    uVar6 = *(undefined8 *)(q + 8);
    uVar7 = *(undefined8 *)(q + 0x16);
    *(undefined8 *)(r + 0xe) = *(undefined8 *)(q + 0xe);
    *(undefined8 *)(r + 0x16) = uVar7;
    *(undefined8 *)r = uVar5;
    *(undefined8 *)(r + 8) = uVar6;
    uVar10 = *(undefined4 *)puVar1;
    uVar11 = *(undefined4 *)(q + 0x22);
    uVar12 = *(undefined4 *)(q + 0x26);
    uVar13 = *(undefined4 *)(q + 0x2a);
    uVar14 = *(undefined4 *)(q + 0x2c);
    uVar15 = *(undefined4 *)(q + 0x30);
    uVar16 = *(undefined4 *)(q + 0x34);
    uVar17 = *(undefined4 *)(q + 0x38);
  }
  else {
LAB_001027ad:
    lVar8 = 0;
    do {
      puVar3 = q + lVar8;
      if (*puVar3 != '\0') break;
      bVar9 = lVar8 != 0x1d;
      lVar8 = lVar8 + 1;
    } while (bVar9);
    if (*puVar3 != '\0') {
LAB_001027cc:
      lVar8 = 0;
      do {
        local_98[lVar8] = q[lVar8] ^ p[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x1e);
      lVar8 = 0;
      do {
        pbVar4 = local_98 + lVar8;
        if (*pbVar4 != 0) break;
        bVar9 = lVar8 != 0x1d;
        lVar8 = lVar8 + 1;
      } while (bVar9);
      if (*pbVar4 != 0) {
        elt_inv(local_78,local_98);
        lVar8 = 0;
        do {
          local_98[lVar8] = puVar1[lVar8] ^ puVar2[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x1e);
        elt_mul(local_58,local_78,local_98);
        elt_square(local_78,local_58);
        lVar8 = 0;
        do {
          local_78[lVar8] = local_78[lVar8] ^ local_58[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x1e);
        lVar8 = 0;
        do {
          local_78[lVar8] = local_78[lVar8] ^ q[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x1e);
        local_78[0x1d] = local_78[0x1d] ^ 1;
        elt_mul(local_98,local_58,local_78);
        lVar8 = 0;
        do {
          local_58[lVar8] = puVar2[lVar8] ^ local_98[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x1e);
        lVar8 = 0;
        do {
          r[lVar8] = p[lVar8] ^ local_78[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x1e);
        lVar8 = 0;
        do {
          r[lVar8 + 0x1e] = r[lVar8] ^ local_58[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x1e);
        return;
      }
      lVar8 = 0;
      do {
        local_98[lVar8] = puVar1[lVar8] ^ p[lVar8 + 0x1e];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x1e);
      lVar8 = 0;
      do {
        pbVar4 = local_98 + lVar8;
        if (*pbVar4 != 0) break;
        bVar9 = lVar8 != 0x1d;
        lVar8 = lVar8 + 1;
      } while (bVar9);
      if (*pbVar4 != 0) {
        r[0x2c] = '\0';
        r[0x2d] = '\0';
        r[0x2e] = '\0';
        r[0x2f] = '\0';
        r[0x30] = '\0';
        r[0x31] = '\0';
        r[0x32] = '\0';
        r[0x33] = '\0';
        r[0x34] = '\0';
        r[0x35] = '\0';
        r[0x36] = '\0';
        r[0x37] = '\0';
        r[0x38] = '\0';
        r[0x39] = '\0';
        r[0x3a] = '\0';
        r[0x3b] = '\0';
        r[0x20] = '\0';
        r[0x21] = '\0';
        r[0x22] = '\0';
        r[0x23] = '\0';
        r[0x24] = '\0';
        r[0x25] = '\0';
        r[0x26] = '\0';
        r[0x27] = '\0';
        r[0x28] = '\0';
        r[0x29] = '\0';
        r[0x2a] = '\0';
        r[0x2b] = '\0';
        r[0x2c] = '\0';
        r[0x2d] = '\0';
        r[0x2e] = '\0';
        r[0x2f] = '\0';
        r[0x10] = '\0';
        r[0x11] = '\0';
        r[0x12] = '\0';
        r[0x13] = '\0';
        r[0x14] = '\0';
        r[0x15] = '\0';
        r[0x16] = '\0';
        r[0x17] = '\0';
        r[0x18] = '\0';
        r[0x19] = '\0';
        r[0x1a] = '\0';
        r[0x1b] = '\0';
        r[0x1c] = '\0';
        r[0x1d] = '\0';
        r[0x1e] = '\0';
        r[0x1f] = '\0';
        r[0] = '\0';
        r[1] = '\0';
        r[2] = '\0';
        r[3] = '\0';
        r[4] = '\0';
        r[5] = '\0';
        r[6] = '\0';
        r[7] = '\0';
        r[8] = '\0';
        r[9] = '\0';
        r[10] = '\0';
        r[0xb] = '\0';
        r[0xc] = '\0';
        r[0xd] = '\0';
        r[0xe] = '\0';
        r[0xf] = '\0';
        return;
      }
      point_double(r,p);
      return;
    }
    lVar8 = -0x1e;
    do {
      if (q[lVar8 + 0x3c] != '\0') goto LAB_001027cc;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0);
    uVar5 = *(undefined8 *)p;
    uVar6 = *(undefined8 *)(p + 8);
    uVar7 = *(undefined8 *)(p + 0x16);
    *(undefined8 *)(r + 0xe) = *(undefined8 *)(p + 0xe);
    *(undefined8 *)(r + 0x16) = uVar7;
    *(undefined8 *)r = uVar5;
    *(undefined8 *)(r + 8) = uVar6;
    uVar10 = *(undefined4 *)puVar2;
    uVar11 = *(undefined4 *)(p + 0x22);
    uVar12 = *(undefined4 *)(p + 0x26);
    uVar13 = *(undefined4 *)(p + 0x2a);
    uVar14 = *(undefined4 *)(p + 0x2c);
    uVar15 = *(undefined4 *)(p + 0x30);
    uVar16 = *(undefined4 *)(p + 0x34);
    uVar17 = *(undefined4 *)(p + 0x38);
  }
  *(undefined4 *)(r + 0x2c) = uVar14;
  *(undefined4 *)(r + 0x30) = uVar15;
  *(undefined4 *)(r + 0x34) = uVar16;
  *(undefined4 *)(r + 0x38) = uVar17;
  *(undefined4 *)(r + 0x1e) = uVar10;
  *(undefined4 *)(r + 0x22) = uVar11;
  *(undefined4 *)(r + 0x26) = uVar12;
  *(undefined4 *)(r + 0x2a) = uVar13;
  return;
}

Assistant:

static void point_add(u8 *r, u8 *p, u8 *q)
{
	u8 s[30], t[30], u[30];
	u8 *px, *py, *qx, *qy, *rx, *ry;

	px = p;
	py = p + 30;
	qx = q;
	qy = q + 30;
	rx = r;
	ry = r + 30;

	if (point_is_zero(p)) {
		elt_copy(rx, qx);
		elt_copy(ry, qy);
		return;
	}

	if (point_is_zero(q)) {
		elt_copy(rx, px);
		elt_copy(ry, py);
		return;
	}

	elt_add(u, px, qx);

	if (elt_is_zero(u)) {
		elt_add(u, py, qy);
		if (elt_is_zero(u))
			point_double(r, p);
		else {
			elt_zero(rx);
			elt_zero(ry);
		}

		return;
	}

	elt_inv(t, u);
	elt_add(u, py, qy);
	elt_mul(s, t, u);

	elt_square(t, s);
	elt_add(t, t, s);
	elt_add(t, t, qx);
	t[29] ^= 1;

	elt_mul(u, s, t);
	elt_add(s, u, py);
	elt_add(rx, t, px);
	elt_add(ry, s, rx);
}